

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

sexp_conflict
sexp_set_root_directory_x_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0)

{
  int iVar1;
  int *in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sexp_conflict res;
  int err;
  sexp_conflict local_38;
  sexp_conflict local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 9)) {
    iVar1 = chroot((char *)(*(long *)(in_RCX + 2) + 0x10 + *(long *)(in_RCX + 4)));
    if (iVar1 == 0) {
      local_38 = (sexp_conflict)0x13e;
    }
    else {
      local_38 = (sexp_conflict)0x3e;
    }
    local_8 = local_38;
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,9,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_set_root_directory_x_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0) {
  int err = 0;
  sexp res;
  if (! sexp_stringp(arg0))
    return sexp_type_exception(ctx, self, SEXP_STRING, arg0);
  err = chroot(sexp_string_data(arg0));
  if (err) {
  res = SEXP_FALSE;
  } else {
  res = SEXP_TRUE;
  }
  return res;
}